

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O2

int GetPressureMS580314BA(MS580314BA *pMS580314BA,double *pPressure)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  unsigned_long D1;
  unsigned_long D2;
  
  D1 = 0;
  D2 = 0;
  WriteDataMS580314BA(pMS580314BA,'B');
  WriteDataMS580314BA(pMS580314BA,'\0');
  ReadDataMS580314BA(pMS580314BA,1,&D1);
  WriteDataMS580314BA(pMS580314BA,'R');
  WriteDataMS580314BA(pMS580314BA,'\0');
  ReadDataMS580314BA(pMS580314BA,1,&D2);
  auVar2._8_4_ = (int)(D2 >> 0x20);
  auVar2._0_8_ = D2;
  auVar2._12_4_ = 0x45300000;
  dVar1 = pMS580314BA->Ca[5] * -256.0 +
          (auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)D2) - 4503599627370496.0);
  dVar3 = pMS580314BA->Ca[6] * dVar1 * 1.1920928955078125e-07 + 2000.0;
  dVar4 = dVar3 + -2000.0;
  if (dVar3 <= 2000.0) {
    dVar5 = dVar4 * 3.0 * dVar4 * 0.5;
    dVar4 = dVar4 * 5.0 * dVar4 * 0.125;
  }
  else {
    dVar5 = dVar4 * dVar4 * 0.0625;
    dVar4 = 0.0;
  }
  if (dVar3 < -1500.0) {
    dVar3 = (dVar3 + 1500.0) * (dVar3 + 1500.0);
    dVar5 = dVar5 + dVar3 * 7.0;
    dVar4 = dVar4 + dVar3 * 4.0;
  }
  if (D2 == 0 || D1 == 0) {
    dVar1 = *pPressure;
  }
  else {
    auVar6._8_4_ = (int)(D1 >> 0x20);
    auVar6._0_8_ = D1;
    auVar6._12_4_ = 0x45300000;
    dVar1 = (((((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)D1) - 4503599627370496.0)) *
               ((dVar1 * pMS580314BA->Ca[3] * 0.00390625 + pMS580314BA->Ca[1] * 32768.0) - dVar4) *
               4.76837158203125e-07 -
              ((pMS580314BA->Ca[4] * dVar1 * 0.0078125 + pMS580314BA->Ca[2] * 65536.0) - dVar5)) *
             3.0517578125e-05) / 10.0) / 1000.0;
    *pPressure = dVar1;
  }
  pMS580314BA->LastPressure = dVar1;
  return 0;
}

Assistant:

inline int GetPressureMS580314BA(MS580314BA* pMS580314BA, double* pPressure)
{
	unsigned long D1 = 0, D2 = 0;
	//double tim = 0, ini = 0, fin = 0;
	//double OFF = 0, dt = 0, TEM = 0, P = 0, SENS = 0, T2 = 0, OFF2 = 0, SENS2 = 0, z = 0, zini = 0, TEMPE = 0, Pres = 0, zant = 0;
	double OFF = 0, dt = 0, TEM = 0, P = 0, SENS = 0, T2 = 0, OFF2 = 0, SENS2 = 0, TEMPE = 0, Pres = 0;

	//double depth = Pressure2Height(*pPressure, pMS580314BA->PressureRef, pMS580314BA->WaterDensity); // ...

	// Missing error checking...

	WriteDataMS580314BA(pMS580314BA, 0x42); // Convert D1 (OSR=512)
	WriteDataMS580314BA(pMS580314BA, 0x00);
	ReadDataMS580314BA(pMS580314BA, 1, &D1);

	WriteDataMS580314BA(pMS580314BA, 0x52); // Convert D2 (OSR=512)
	WriteDataMS580314BA(pMS580314BA, 0x00);
	ReadDataMS580314BA(pMS580314BA, 1, &D2);

	dt = D2-pMS580314BA->Ca[5]*256;
	TEM = 2000+dt*pMS580314BA->Ca[6]/8388608;

	OFF = pMS580314BA->Ca[2]*65536;
	OFF = OFF+(pMS580314BA->Ca[4]*dt)/128;

	SENS = pMS580314BA->Ca[1]*32768;
	SENS = SENS+(pMS580314BA->Ca[3]*dt)/256;

	if (TEM <= 2000)
	{
		T2 = 3*(dt*dt);
		T2 = T2/8589934592.0;
		OFF2 = 3*(TEM-2000)*(TEM-2000)/2;
		SENS2 = 5*(TEM-2000)*(TEM-2000)/8;
	}
	else
	{
		T2 = 7*(dt*dt);
		T2 = T2/137438953472.0;
		OFF2 = 1*(TEM-2000)*(TEM-2000)/16;
		SENS2 = 0;
	}

	////Sleep(100);

	if (TEM < -1500)
	{
		OFF2 = OFF2+7*((TEM+1500)*(TEM+1500));
		SENS2 = SENS2+4*((TEM+1500)*(TEM+1500));
	}

	TEM = TEM-T2;
	OFF = OFF-OFF2;
	SENS = SENS-SENS2;

	P = (D1*SENS/2097152-OFF)/32768;

	Pres = P/10.0;
	TEMPE = TEM/100.0;

	//if (tim<1) { zini = (Pres*100)/9810; }
	//if (pMS580314BA->PressureIni == 0) { pMS580314BA->PressureIni = Pres; }

	if ((D1 == 0)||(D2 == 0))
	{
		//depth = depth;
		*pPressure = *pPressure; // ?
	}
	else
	{
		//depth = (Pres*100)/9810-(pMS580314BA->PressureRef*100)/9810;
		//*pPressure = (Pres-pMS580314BA->PressureIni)*(100.0/9810.0)*pMS580314BA->WaterDensity*STANDARD_GRAVITY/1e5;
		*pPressure = Pres/1000.0;
	}

	// ...

	//printf("*pPressure=%f,\n",*pPressure);

	//*pPressure = pMS580314BA->PressureRef-depth*(pMS580314BA->WaterDensity*STANDARD_GRAVITY)/1e5;

	pMS580314BA->LastPressure = *pPressure;

	return EXIT_SUCCESS;
}